

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O0

void __thiscall
FDDSTexture::FDDSTexture(FDDSTexture *this,FileReader *lump,int lumpnum,void *vsurfdesc)

{
  DWORD DVar1;
  DDSURFACEDESC2 *surf;
  void *vsurfdesc_local;
  int lumpnum_local;
  FileReader *lump_local;
  FDDSTexture *this_local;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,lumpnum);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FDDSTexture_00b87b40;
  this->Pixels = (BYTE *)0x0;
  this->Spans = (Span **)0x0;
  (this->super_FTexture).UseType = '\b';
  (this->super_FTexture).LeftOffset = 0;
  (this->super_FTexture).TopOffset = 0;
  (this->super_FTexture).field_0x31 = (this->super_FTexture).field_0x31 & 0xf7;
  (this->super_FTexture).Width = *(WORD *)((long)vsurfdesc + 0xc);
  (this->super_FTexture).Height = *(WORD *)((long)vsurfdesc + 8);
  FTexture::CalcBitSize(&this->super_FTexture);
  if ((*(uint *)((long)vsurfdesc + 0x4c) & 4) == 0) {
    this->Format = *(uint *)((long)vsurfdesc + 0x54) >> 3;
    DVar1 = *(DWORD *)((long)vsurfdesc + 0x58);
    this->RMask = DVar1;
    CalcBitShift(DVar1,&this->RShiftL,&this->RShiftR);
    DVar1 = *(DWORD *)((long)vsurfdesc + 0x5c);
    this->GMask = DVar1;
    CalcBitShift(DVar1,&this->GShiftL,&this->GShiftR);
    DVar1 = *(DWORD *)((long)vsurfdesc + 0x60);
    this->BMask = DVar1;
    CalcBitShift(DVar1,&this->BShiftL,&this->BShiftR);
    if ((*(uint *)((long)vsurfdesc + 0x4c) & 1) == 0) {
      this->AMask = 0;
      this->AShiftR = '\0';
      this->AShiftL = '\0';
    }
    else {
      DVar1 = *(DWORD *)((long)vsurfdesc + 100);
      this->AMask = DVar1;
      CalcBitShift(DVar1,&this->AShiftL,&this->AShiftR);
    }
    if ((*(uint *)((long)vsurfdesc + 4) & 8) == 0) {
      this->Pitch = (uint)(this->super_FTexture).Width * this->Format + 3 & 0xfffffffc;
    }
    else {
      this->Pitch = *(SDWORD *)((long)vsurfdesc + 0x10);
    }
    this->LinearSize = this->Pitch * (uint)(this->super_FTexture).Height;
  }
  else {
    this->Format = *(DWORD *)((long)vsurfdesc + 0x50);
    this->Pitch = 0;
    this->LinearSize = *(DWORD *)((long)vsurfdesc + 0x10);
  }
  return;
}

Assistant:

FDDSTexture::FDDSTexture (FileReader &lump, int lumpnum, void *vsurfdesc)
: FTexture(NULL, lumpnum), Pixels(0), Spans(0)
{
	DDSURFACEDESC2 *surf = (DDSURFACEDESC2 *)vsurfdesc;

	UseType = TEX_MiscPatch;
	LeftOffset = 0;
	TopOffset = 0;
	bMasked = false;

	Width = WORD(surf->Width);
	Height = WORD(surf->Height);
	CalcBitSize ();

	if (surf->PixelFormat.Flags & DDPF_FOURCC)
	{
		Format = surf->PixelFormat.FourCC;
		Pitch = 0;
		LinearSize = surf->LinearSize;
	}
	else	// DDPF_RGB
	{
		Format = surf->PixelFormat.RGBBitCount >> 3;
		CalcBitShift (RMask = surf->PixelFormat.RBitMask, &RShiftL, &RShiftR);
		CalcBitShift (GMask = surf->PixelFormat.GBitMask, &GShiftL, &GShiftR);
		CalcBitShift (BMask = surf->PixelFormat.BBitMask, &BShiftL, &BShiftR);
		if (surf->PixelFormat.Flags & DDPF_ALPHAPIXELS)
		{
			CalcBitShift (AMask = surf->PixelFormat.RGBAlphaBitMask, &AShiftL, &AShiftR);
		}
		else
		{
			AMask = 0;
			AShiftL = AShiftR = 0;
		}
		if (surf->Flags & DDSD_PITCH)
		{
			Pitch = surf->Pitch;
		}
		else
		{
			Pitch = (Width * Format + 3) & ~3;
		}
		LinearSize = Pitch * Height;
	}
}